

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

_Bool is_in_array(int *hay,size_t length,int needle)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    uVar2 = uVar1;
    if (length == uVar1) goto LAB_001011d4;
    if (hay[uVar1] == needle) {
      uVar2 = 1;
      goto LAB_001011d4;
    }
    uVar2 = uVar1 + 1;
  } while (hay[uVar1] <= needle);
  uVar2 = 0;
LAB_001011d4:
  return (_Bool)(uVar1 < length & (byte)uVar2);
}

Assistant:

bool is_in_array(const int* hay, const size_t length, const int needle) {
  for (size_t n = 0; n < length; n++) {
    if (hay[n] == needle) return true;
    else if (hay[n] > needle) return false;
  }
  return false;
}